

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O3

void duckdb::ExtensionHelper::LoadExternalExtension
               (DatabaseInstance *db,FileSystem *fs,string *extension)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  code *pcVar4;
  type pEVar5;
  IOException *pIVar6;
  long *plVar7;
  FatalException *this_00;
  size_type *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> init_fun_name;
  ExtensionInitResult extension_init_result;
  duckdb_extension_access access;
  ErrorData error;
  undefined1 *local_fe8;
  long local_fe0;
  undefined1 local_fd8 [16];
  string local_fc8;
  undefined1 local_fa8 [72];
  _Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false> local_f60;
  void *local_f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e90 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10;
  code *local_df0;
  code *local_de8;
  code *local_de0;
  undefined1 local_dd8 [16];
  DatabaseInstance local_dc8;
  bool local_b8;
  undefined1 local_b0 [128];
  
  bVar2 = DatabaseInstance::ExtensionIsLoaded(db,extension);
  if (bVar2) {
    return;
  }
  InitialLoad((ExtensionInitResult *)local_fa8,db,fs,extension);
  if (local_fa8[0x40] == CPP) {
    local_fe8 = local_fd8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_fe8,local_fa8._32_8_,(pointer)(local_fa8._32_8_ + local_fa8._40_8_))
    ;
    ::std::__cxx11::string::append((char *)&local_fe8);
    pcVar4 = (code *)dlsym(local_f58,local_fe8);
    if (pcVar4 == (code *)0x0) {
      pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
      local_dd8._0_8_ = &local_dc8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_dd8,
                 "Extension \'%s\' did not contain the expected entrypoint function \'%s\'","");
      local_e50._M_dataplus._M_p = (pointer)&local_e50.field_2;
      pcVar1 = (extension->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e50,pcVar1,pcVar1 + extension->_M_string_length);
      local_ef0._M_dataplus._M_p = (pointer)&local_ef0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ef0,local_fe8,local_fe8 + local_fe0);
      IOException::IOException<std::__cxx11::string,std::__cxx11::string>
                (pIVar6,(string *)local_dd8,&local_e50,&local_ef0);
      __cxa_throw(pIVar6,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (*pcVar4)(db);
    pEVar5 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
             ::operator*((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                          *)&local_f60);
    DatabaseInstance::SetExtensionLoaded(db,extension,pEVar5);
    if (local_fe8 == local_fd8) goto LAB_015fac7a;
  }
  else {
    if ((local_fa8[0x40] & ~CPP) != C_STRUCT) {
      pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
      local_dd8._0_8_ = &local_dc8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_dd8,"Unknown ABI type of value \'%s\' for extension \'%s\'","");
      local_ed0._M_dataplus._M_p = (pointer)&local_ed0.field_2;
      pcVar1 = (extension->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ed0,pcVar1,pcVar1 + extension->_M_string_length);
      IOException::IOException<unsigned_char,std::__cxx11::string>
                (pIVar6,(string *)local_dd8,local_fa8[0x40],&local_ed0);
      __cxa_throw(pIVar6,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_fe8 = local_fd8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_fe8,local_fa8._32_8_,(pointer)(local_fa8._32_8_ + local_fa8._40_8_))
    ;
    ::std::__cxx11::string::append((char *)&local_fe8);
    pcVar4 = (code *)dlsym(local_f58,local_fe8);
    if (pcVar4 == (code *)0x0) {
      pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
      local_dd8._0_8_ = &local_dc8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_dd8,"File \"%s\" did not contain function \"%s\": %s","");
      local_e90[0]._M_dataplus._M_p = (pointer)&local_e90[0].field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_e90,local_fa8._0_8_,(pointer)(local_fa8._0_8_ + local_fa8._8_8_));
      local_f50[0]._M_dataplus._M_p = (pointer)&local_f50[0].field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_f50,local_fe8,local_fe8 + local_fe0);
      GetDLError_abi_cxx11_();
      IOException::IOException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (pIVar6,(string *)local_dd8,local_e90,local_f50,&local_e10);
      __cxa_throw(pIVar6,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    DuckDBExtensionLoadState::DuckDBExtensionLoadState
              ((DuckDBExtensionLoadState *)local_dd8,db,(ExtensionInitResult *)local_fa8);
    local_df0 = ExtensionAccess::SetError;
    local_de8 = ExtensionAccess::GetDatabase;
    local_de0 = ExtensionAccess::GetAPI;
    cVar3 = (*pcVar4)(local_dd8);
    if (local_b8 == true) {
      ::std::operator+(&local_e30,"An error was thrown during initialization of the extension \'",
                       extension);
      plVar7 = (long *)::std::__cxx11::string::append((char *)&local_e30);
      local_fc8._M_dataplus._M_p = (pointer)*plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_fc8._M_dataplus._M_p == psVar8) {
        local_fc8.field_2._M_allocated_capacity = *psVar8;
        local_fc8.field_2._8_8_ = plVar7[3];
        local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      }
      else {
        local_fc8.field_2._M_allocated_capacity = *psVar8;
      }
      local_fc8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ErrorData::Throw((ErrorData *)local_b0,(string *)&local_fc8);
    }
    if (cVar3 == '\0') {
      this_00 = (FatalException *)__cxa_allocate_exception(0x10);
      local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fc8,
                 "Extension \'%s\' failed to initialize but did not return an error. This indicates an error in the extension: C API extensions should return a boolean `true` to indicate succesful initialization. This means that the Extension may be partially initialized resulting in an inconsistent state of DuckDB."
                 ,"");
      local_eb0._M_dataplus._M_p = (pointer)&local_eb0.field_2;
      pcVar1 = (extension->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_eb0,pcVar1,pcVar1 + extension->_M_string_length);
      FatalException::FatalException<std::__cxx11::string>(this_00,&local_fc8,&local_eb0);
      __cxa_throw(this_00,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar5 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
             ::operator*((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                          *)&local_f60);
    DatabaseInstance::SetExtensionLoaded(db,extension,pEVar5);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
      operator_delete((void *)local_b0._8_8_);
    }
    if (local_dc8.super_enable_shared_from_this<duckdb::DatabaseInstance>.__weak_this_.internal.
        super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_dc8.super_enable_shared_from_this<duckdb::DatabaseInstance>.__weak_this_.
                    internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 8))->_M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      operator_delete(local_dc8.super_enable_shared_from_this<duckdb::DatabaseInstance>.__weak_this_
                      .internal.
                      super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
    }
    if (local_fe8 == local_fd8) goto LAB_015fac7a;
  }
  operator_delete(local_fe8);
LAB_015fac7a:
  if ((_Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>)local_f60._M_head_impl !=
      (_Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>)0x0) {
    ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
              ((default_delete<duckdb::ExtensionInstallInfo> *)&local_f60,local_f60._M_head_impl);
  }
  local_f60._M_head_impl = (ExtensionInstallInfo *)0x0;
  if ((undefined1 *)local_fa8._32_8_ != local_fa8 + 0x30) {
    operator_delete((void *)local_fa8._32_8_);
  }
  if ((undefined1 *)local_fa8._0_8_ != local_fa8 + 0x10) {
    operator_delete((void *)local_fa8._0_8_);
  }
  return;
}

Assistant:

void ExtensionHelper::LoadExternalExtension(DatabaseInstance &db, FileSystem &fs, const string &extension) {
	if (db.ExtensionIsLoaded(extension)) {
		return;
	}
#ifdef DUCKDB_DISABLE_EXTENSION_LOAD
	throw PermissionException("Loading external extensions is disabled through a compile time flag");
#else
	auto extension_init_result = InitialLoad(db, fs, extension);

	// C++ ABI
	if (extension_init_result.abi_type == ExtensionABIType::CPP) {
		auto init_fun_name = extension_init_result.filebase + "_init";
		ext_init_fun_t init_fun = TryLoadFunctionFromDLL<ext_init_fun_t>(extension_init_result.lib_hdl, init_fun_name,
		                                                                 extension_init_result.filename);
		if (!init_fun) {
			throw IOException("Extension '%s' did not contain the expected entrypoint function '%s'", extension,
			                  init_fun_name);
		}

		try {
			(*init_fun)(db);
		} catch (std::exception &e) {
			ErrorData error(e);
			throw InvalidInputException("Initialization function \"%s\" from file \"%s\" threw an exception: \"%s\"",
			                            init_fun_name, extension_init_result.filename, error.RawMessage());
		}

		D_ASSERT(extension_init_result.install_info);

		db.SetExtensionLoaded(extension, *extension_init_result.install_info);
		return;
	}

	// C ABI
	if (extension_init_result.abi_type == ExtensionABIType::C_STRUCT ||
	    extension_init_result.abi_type == ExtensionABIType::C_STRUCT_UNSTABLE) {
		auto init_fun_name = extension_init_result.filebase + "_init_c_api";
		ext_init_c_api_fun_t init_fun_capi = TryLoadFunctionFromDLL<ext_init_c_api_fun_t>(
		    extension_init_result.lib_hdl, init_fun_name, extension_init_result.filename);

		if (!init_fun_capi) {
			throw IOException("File \"%s\" did not contain function \"%s\": %s", extension_init_result.filename,
			                  init_fun_name, GetDLError());
		}
		// Create the load state
		DuckDBExtensionLoadState load_state(db, extension_init_result);

		auto access = ExtensionAccess::CreateAccessStruct();
		auto result = (*init_fun_capi)(load_state.ToCStruct(), &access);

		// Throw any error that the extension might have encountered
		if (load_state.has_error) {
			load_state.error_data.Throw("An error was thrown during initialization of the extension '" + extension +
			                            "': ");
		}

		// Extensions are expected to either set an error or return true indicating successful initialization
		if (result == false) {
			throw FatalException(
			    "Extension '%s' failed to initialize but did not return an error. This indicates an "
			    "error in the extension: C API extensions should return a boolean `true` to indicate succesful "
			    "initialization. "
			    "This means that the Extension may be partially initialized resulting in an inconsistent state of "
			    "DuckDB.",
			    extension);
		}

		D_ASSERT(extension_init_result.install_info);

		db.SetExtensionLoaded(extension, *extension_init_result.install_info);
		return;
	}

	throw IOException("Unknown ABI type of value '%s' for extension '%s'",
	                  static_cast<uint8_t>(extension_init_result.abi_type), extension);
#endif
}